

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O1

int __thiscall
jsoncons::jsonpath::detail::
slice_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(slice_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  long lVar1;
  supertype *psVar2;
  bool bVar3;
  uint uVar4;
  undefined7 extraout_var;
  size_t sVar5;
  path_node_type *ppVar6;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar7;
  int64_t i;
  size_t sVar8;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
  *this_00;
  int64_t i_1;
  ulong i_00;
  size_t sVar9;
  uint in_stack_00000008;
  basic_path_node<char> *local_50;
  size_t local_48;
  fd_set *local_40;
  size_t local_38;
  
  this_00 = (eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
             *)CONCAT44(in_register_00000034,__nfds);
  local_40 = __readfds;
  bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__exceptfds
                    );
  sVar5 = CONCAT71(extraout_var,bVar3);
  if (bVar3) {
    sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    if ((this->slice_).start_.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      lVar1 = (this->slice_).start_.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value;
      i_00 = (lVar1 >> 0x3f & sVar5) + lVar1;
      if ((long)sVar5 <= (long)i_00) {
        i_00 = sVar5;
      }
    }
    else {
      i_00 = (this->slice_).step_ >> 0x3f & sVar5;
    }
    sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    if ((this->slice_).stop_.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      lVar1 = (this->slice_).stop_.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value;
      sVar9 = (lVar1 >> 0x3f & sVar5) + lVar1;
      if ((long)sVar5 <= (long)sVar9) {
        sVar9 = sVar5;
      }
    }
    else {
      sVar9 = 0xffffffffffffffff;
      if (-1 < (this->slice_).step_) {
        sVar9 = sVar5;
      }
    }
    sVar5 = (this->slice_).step_;
    local_38 = sVar5;
    if ((long)sVar5 < 1) {
      if ((long)sVar5 < 0) {
        sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           __exceptfds);
        if ((long)sVar5 <= (long)i_00) {
          sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             __exceptfds);
          i_00 = sVar5 - 1;
        }
        sVar8 = 0xffffffffffffffff;
        if (-1 < (long)sVar9) {
          sVar8 = sVar9;
        }
        if ((long)sVar8 < (long)i_00) {
          do {
            sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               __exceptfds);
            if (i_00 < sVar5) {
              ppVar6 = (path_node_type *)__writefds;
              local_48 = i_00;
              if ((in_stack_00000008 & 0xb) != 0) {
                local_50 = (basic_path_node<char> *)__writefds;
                ppVar6 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                         ::
                         create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                                   (this_00,&local_50,&local_48);
              }
              pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                 ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                                   *)__exceptfds,i_00);
              psVar2 = (this->
                       super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                       ).tail_;
              if (psVar2 == (supertype *)0x0) {
                sVar5 = (**(code **)(__timeout->tv_sec + 0x10))(__timeout,ppVar6,pbVar7);
              }
              else {
                uVar4 = (*psVar2->_vptr_jsonpath_selector[2])
                                  (psVar2,this_00,local_40,ppVar6,pbVar7,__timeout,in_stack_00000008
                                  );
                sVar5 = (size_t)uVar4;
              }
            }
            i_00 = i_00 + local_38;
          } while ((long)sVar8 < (long)i_00);
        }
      }
    }
    else {
      sVar8 = 0;
      if (0 < (long)i_00) {
        sVar8 = i_00;
      }
      sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
      if ((long)sVar5 < (long)sVar9) {
        sVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           __exceptfds);
        sVar9 = sVar5;
      }
      if ((long)sVar8 < (long)sVar9) {
        do {
          ppVar6 = (path_node_type *)__writefds;
          local_48 = sVar8;
          if ((in_stack_00000008 & 0xb) != 0) {
            local_50 = (basic_path_node<char> *)__writefds;
            ppVar6 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                     ::
                     create_path_node<jsoncons::jsonpath::basic_path_node<char>const*,unsigned_long&>
                               (this_00,&local_50,&local_48);
          }
          pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                             ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              __exceptfds,sVar8);
          psVar2 = (this->
                   super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   ).tail_;
          if (psVar2 == (supertype *)0x0) {
            sVar5 = (**(code **)(__timeout->tv_sec + 0x10))(__timeout,ppVar6,pbVar7);
          }
          else {
            uVar4 = (*psVar2->_vptr_jsonpath_selector[2])
                              (psVar2,this_00,local_40,ppVar6,pbVar7,__timeout,in_stack_00000008);
            sVar5 = (size_t)uVar4;
          }
          sVar8 = sVar8 + local_38;
        } while ((long)sVar8 < (long)sVar9);
      }
    }
  }
  return (int)sVar5;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current,
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                auto start = slice_.get_start(current.size());
                auto end = slice_.get_stop(current.size());
                auto step = slice_.step();

                if (step > 0)
                {
                    if (start < 0)
                    {
                        start = 0;
                    }
                    if (end > static_cast<int64_t>(current.size()))
                    {
                        end = current.size();
                    }
                    for (int64_t i = start; i < end; i += step)
                    {
                        auto j = static_cast<std::size_t>(i);
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, j, options), 
                                            current[j], receiver, options);
                    }
                }
                else if (step < 0)
                {
                    if (start >= static_cast<int64_t>(current.size()))
                    {
                        start = static_cast<int64_t>(current.size()) - 1;
                    }
                    if (end < -1)
                    {
                        end = -1;
                    }
                    for (int64_t i = start; i > end; i += step)
                    {
                        auto j = static_cast<std::size_t>(i);
                        if (j < current.size())
                        {
                            this->tail_select(context, root, 
                                                path_generator_type::generate(context, last,j,options), current[j], receiver, options);
                        }
                    }
                }
            }
        }